

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O0

void __thiscall
slang::ast::CaseStatement::serializeTo(CaseStatement *this,ASTSerializer *serializer)

{
  string_view name;
  string_view name_00;
  ASTSerializer *this_00;
  bool bVar1;
  Statement *__n;
  ASTSerializer *in_RSI;
  long in_RDI;
  Expression *ex;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  ItemGroup *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *__range2;
  Expression *in_stack_fffffffffffffed8;
  ASTSerializer *in_stack_fffffffffffffee0;
  ASTSerializer *in_stack_fffffffffffffee8;
  ASTSerializer *in_stack_fffffffffffffef0;
  ASTSerializer *this_01;
  int local_e0;
  void *local_d8;
  int local_d0;
  void *local_c8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_b0;
  reference local_a8;
  reference local_90;
  ItemGroup *local_88;
  __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
  local_80;
  long local_78;
  int local_60;
  void *local_58;
  string_view local_50;
  int local_40;
  void *local_38;
  string_view local_30;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
             (char *)in_stack_fffffffffffffee8);
  local_30 = ast::toString(Normal);
  ASTSerializer::write(in_RSI,local_20,local_18,local_30._M_len);
  this_01 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
             (char *)in_stack_fffffffffffffee8);
  local_50 = ast::toString(None);
  ASTSerializer::write(this_01,local_40,local_38,local_50._M_len);
  this_00 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
             (char *)in_stack_fffffffffffffee8);
  ASTSerializer::write(this_00,local_60,local_58,*(size_t *)(in_RDI + 0x20));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
             (char *)in_stack_fffffffffffffee8);
  name._M_str = (char *)this_01;
  name._M_len = (size_t)in_RSI;
  ASTSerializer::startArray(in_stack_fffffffffffffef0,name);
  local_78 = in_RDI + 0x28;
  local_80._M_current =
       (ItemGroup *)
       std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
                  in_stack_fffffffffffffed8);
  local_88 = (ItemGroup *)
             std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::end
                       ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
                        in_stack_fffffffffffffee8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffee0,
                       (__normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffed8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_90 = __gnu_cxx::
               __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
               ::operator*(&local_80);
    ASTSerializer::startObject((ASTSerializer *)0xa34c40);
    in_stack_fffffffffffffef0 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
               (char *)in_stack_fffffffffffffee8);
    name_00._M_str = (char *)this_01;
    name_00._M_len = (size_t)in_RSI;
    ASTSerializer::startArray(in_stack_fffffffffffffef0,name_00);
    local_a8 = local_90;
    local_b0._M_current =
         (Expression **)
         std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffed8);
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
               in_stack_fffffffffffffee8);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffee0,
                         (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffffed8);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator*(&local_b0);
      ASTSerializer::serialize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++(&local_b0);
    }
    ASTSerializer::endArray((ASTSerializer *)0xa34d03);
    in_stack_fffffffffffffee8 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
               (char *)local_10);
    __n = not_null<const_slang::ast::Statement_*>::operator*
                    ((not_null<const_slang::ast::Statement_*> *)0xa34d32);
    ASTSerializer::write(in_stack_fffffffffffffee8,local_d0,local_c8,(size_t)__n);
    ASTSerializer::endObject((ASTSerializer *)0xa34d56);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseStatement::ItemGroup_*,_std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>_>
    ::operator++(&local_80);
  }
  ASTSerializer::endArray((ASTSerializer *)0xa34d75);
  if (*(long *)(in_RDI + 0x38) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
               (char *)in_stack_fffffffffffffee8);
    ASTSerializer::write(local_10,local_e0,local_d8,*(size_t *)(in_RDI + 0x38));
  }
  return;
}

Assistant:

void CaseStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("condition", toString(condition));
    serializer.write("check", toString(check));
    serializer.write("expr", expr);
    serializer.startArray("items");
    for (auto const& item : items) {
        serializer.startObject();

        serializer.startArray("expressions");
        for (auto ex : item.expressions) {
            serializer.serialize(*ex);
        }
        serializer.endArray();

        serializer.write("stmt", *item.stmt);

        serializer.endObject();
    }
    serializer.endArray();

    if (defaultCase) {
        serializer.write("defaultCase", *defaultCase);
    }
}